

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string2.cpp
# Opt level: O2

void __thiscall String::String(String *this,String *rhs)

{
  size_t sVar1;
  char *__dest;
  ostream *poVar2;
  
  sVar1 = size(rhs);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->data_ = __dest;
  strcpy(__dest,rhs->data_);
  poVar2 = std::operator<<((ostream *)&std::cout,"String::String(const String&)");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

String(const String& rhs)
    : data_(new char[rhs.size() + 1])
  {
    strcpy(data_, rhs.c_str());
    std::cout << "String::String(const String&)" << std::endl;
  }